

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

void __thiscall pybind11::handle::throw_gilstate_error(handle *this,string *function_name)

{
  pointer pcVar1;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  fprintf(_stderr,
          "%s is being called while the GIL is either not held or invalid. Please see https://pybind11.readthedocs.io/en/stable/advanced/misc.html#common-sources-of-global-interpreter-lock-errors for debugging advice.\nIf you are convinced there is no bug in your code, you can #define PYBIND11_NO_ASSERT_GIL_HELD_INCREF_DECREF to disable this check. In that case you have to ensure this #define is consistently used for all translation units linked into a given pybind11 extension, otherwise there will be ODR violations."
          ,(function_name->_M_dataplus)._M_p);
  if (this->m_ptr->ob_type->tp_name != (char *)0x0) {
    fprintf(_stderr," The failing %s call was triggered on a %s object.",
            (function_name->_M_dataplus)._M_p);
  }
  fputc(10,_stderr);
  fflush(_stderr);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  pcVar1 = (function_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + function_name->_M_string_length);
  std::__cxx11::string::append((char *)local_40);
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_gilstate_error(const std::string &function_name) const {
        fprintf(
            stderr,
            "%s is being called while the GIL is either not held or invalid. Please see "
            "https://pybind11.readthedocs.io/en/stable/advanced/"
            "misc.html#common-sources-of-global-interpreter-lock-errors for debugging advice.\n"
            "If you are convinced there is no bug in your code, you can #define "
            "PYBIND11_NO_ASSERT_GIL_HELD_INCREF_DECREF "
            "to disable this check. In that case you have to ensure this #define is consistently "
            "used for all translation units linked into a given pybind11 extension, otherwise "
            "there will be ODR violations.",
            function_name.c_str());
        if (Py_TYPE(m_ptr)->tp_name != nullptr) {
            fprintf(stderr,
                    " The failing %s call was triggered on a %s object.",
                    function_name.c_str(),
                    Py_TYPE(m_ptr)->tp_name);
        }
        fprintf(stderr, "\n");
        fflush(stderr);
        throw std::runtime_error(function_name + " PyGILState_Check() failure.");
    }